

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void modify_vps(Matrix<double> *mat,
               vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
               *vps,uint beg_row)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *this;
  uint local_84;
  undefined1 local_80 [4];
  uint i;
  Matrix<double> result;
  uint beg_row_local;
  vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
  *vps_local;
  Matrix<double> *mat_local;
  
  result.m_functions[6]._4_4_ = beg_row;
  Matrix<double>::Matrix((Matrix<double> *)local_80,mat);
  local_84 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
            ::size(vps);
    if (sVar1 <= local_84) break;
    pvVar2 = std::
             vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
             ::operator[](vps,(ulong)local_84);
    __x = Matrix<double>::operator[](mat,pvVar2->first);
    this = Matrix<double>::operator[]
                     ((Matrix<double> *)local_80,result.m_functions[6]._4_4_ + local_84);
    std::vector<double,_std::allocator<double>_>::operator=(this,__x);
    local_84 = local_84 + 1;
  }
  Matrix<double>::operator=(mat,(Matrix<double> *)local_80);
  Matrix<double>::~Matrix((Matrix<double> *)local_80);
  return;
}

Assistant:

void modify_vps(Matrix_d& mat, const std::vector<std::pair<unsigned, double>>& vps, unsigned beg_row){
    Matrix_d result=mat;
    for(unsigned i=0;i<vps.size();++i)
        result[beg_row+i]=mat[vps[i].first];
    mat=result;
}